

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int mem_has_null(void *block,uint size)

{
  ulong uVar1;
  
  if (size != 0) {
    uVar1 = 0;
    do {
      if (*(char *)((long)block + uVar1) == '\0') {
        return 1;
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  return 0;
}

Assistant:

int mem_has_null(const void *block, unsigned size)
{
	const unsigned char *bytes = block;
	unsigned i;        
	for(i = 0; i < size; i++)
	{
		if(bytes[i] == 0)
		{
			return 1;
		}
	}
	return 0;
}